

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

char * utf8_fskip(char *s,size_t n,char *lim)

{
  char *local_30;
  char *lim_local;
  size_t n_local;
  char *s_local;
  
  lim_local = (char *)n;
  n_local = (size_t)s;
  while( true ) {
    if (*(char *)n_local == '\0') {
      if (lim_local == (char *)0x0) {
        local_30 = (char *)n_local;
      }
      else {
        local_30 = (char *)0x0;
      }
      return local_30;
    }
    if (((int)*(char *)n_local & 0xc0U) != 0x80) {
      if (lim_local == (char *)0x0) {
        return (char *)n_local;
      }
      lim_local = lim_local + -1;
    }
    if ((char *)n_local == lim) break;
    n_local = n_local + 1;
  }
  return (char *)0x0;
}

Assistant:

char *utf8_fskip(char *s, size_t n, char *lim)
{
	while (1) {
		if (*s == 0) {
			/* Reached the end of the input. */
			return (n > 0) ? NULL : s;
		}
		if ((*s & 0xc0) != 0x80) {
			/* It's not marked as a continuation byte. */
			if (n == 0) {
				return s;
			}
			--n;
		}
		if (s == lim) {
			return NULL;
		}
		++s;
	}
}